

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * __thiscall google::protobuf::io::EpsCopyOutputStream::Next(EpsCopyOutputStream *this)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  int iVar3;
  LogMessage *pLVar4;
  uint8_t *puVar5;
  int size;
  LogFinisher local_59;
  void *data;
  
  if (this->had_error_ == true) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&data,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x314);
    pLVar4 = internal::LogMessage::operator<<((LogMessage *)&data,"CHECK failed: !had_error_: ");
    internal::LogFinisher::operator=((LogFinisher *)&size,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)&data);
  }
  if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
    this->had_error_ = true;
  }
  else {
    puVar1 = this->end_;
    puVar5 = this->buffer_;
    if (this->buffer_end_ != (uint8_t *)0x0) {
      memcpy(this->buffer_end_,puVar5,(long)puVar1 - (long)puVar5);
      do {
        iVar3 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,&data,&size);
        if ((char)iVar3 == '\0') {
          this->had_error_ = true;
          goto LAB_002bcb53;
        }
      } while ((ulong)(uint)size == 0);
      if (0x10 < size) {
        uVar2 = *(undefined8 *)(this->end_ + 8);
        *(undefined8 *)data = *(undefined8 *)this->end_;
        *(undefined8 *)((long)data + 8) = uVar2;
        this->end_ = (uint8_t *)((long)data + ((ulong)(uint)size - 0x10));
        this->buffer_end_ = (uint8_t *)0x0;
        return (uint8_t *)data;
      }
      if (size < 1) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&data,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                   ,0x32a);
        pLVar4 = internal::LogMessage::operator<<((LogMessage *)&data,"CHECK failed: size > 0: ");
        internal::LogFinisher::operator=(&local_59,pLVar4);
        internal::LogMessage::~LogMessage((LogMessage *)&data);
      }
      uVar2 = *(undefined8 *)(this->end_ + 8);
      *(undefined8 *)puVar5 = *(undefined8 *)this->end_;
      *(undefined8 *)(this->buffer_ + 8) = uVar2;
      this->buffer_end_ = (uint8_t *)data;
      puVar5 = puVar5 + size;
      goto LAB_002bcb57;
    }
    uVar2 = *(undefined8 *)(puVar1 + 8);
    *(undefined8 *)puVar5 = *(undefined8 *)puVar1;
    *(undefined8 *)(this->buffer_ + 8) = uVar2;
    this->buffer_end_ = puVar1;
  }
LAB_002bcb53:
  puVar5 = this->buffer_ + 0x10;
LAB_002bcb57:
  this->end_ = puVar5;
  return this->buffer_;
}

Assistant:

uint8_t* EpsCopyOutputStream::Next() {
  GOOGLE_DCHECK(!had_error_);  // NOLINT
  if (PROTOBUF_PREDICT_FALSE(stream_ == nullptr)) return Error();
  if (buffer_end_) {
    // We're in the patch buffer and need to fill up the previous buffer.
    std::memcpy(buffer_end_, buffer_, end_ - buffer_);
    uint8_t* ptr;
    int size;
    do {
      void* data;
      if (PROTOBUF_PREDICT_FALSE(!stream_->Next(&data, &size))) {
        // Stream has an error, we use the patch buffer to continue to be
        // able to write.
        return Error();
      }
      ptr = static_cast<uint8_t*>(data);
    } while (size == 0);
    if (PROTOBUF_PREDICT_TRUE(size > kSlopBytes)) {
      std::memcpy(ptr, end_, kSlopBytes);
      end_ = ptr + size - kSlopBytes;
      buffer_end_ = nullptr;
      return ptr;
    } else {
      GOOGLE_DCHECK(size > 0);  // NOLINT
      // Buffer to small
      std::memmove(buffer_, end_, kSlopBytes);
      buffer_end_ = ptr;
      end_ = buffer_ + size;
      return buffer_;
    }
  } else {
    std::memcpy(buffer_, end_, kSlopBytes);
    buffer_end_ = end_;
    end_ = buffer_ + kSlopBytes;
    return buffer_;
  }
}